

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::apply(MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *out,
                  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_in)

{
  pointer ppMVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  MLLinOp *pMVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int nghost;
  int iVar8;
  long lVar9;
  ulong uVar10;
  MultiFab *pMVar11;
  long lVar12;
  ulong uVar13;
  int alev;
  uint uVar14;
  long local_230;
  IntVect ng_sol;
  IntVect ng;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> rh;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> in;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> in_raii;
  undefined1 local_1b0 [384];
  
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
             (long)this->namrlevs,(allocator_type *)local_1b0);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&in_raii.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
             (long)this->namrlevs,(allocator_type *)local_1b0);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
             (long)this->namrlevs,(allocator_type *)local_1b0);
  ng_sol.vect[0] = 1;
  ng_sol.vect[1] = 1;
  ng_sol.vect[2] = 1;
  uVar13 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar13 < 3) {
    ng_sol.vect[uVar13] = 0;
    iVar8 = ng_sol.vect[0];
    iVar5 = ng_sol.vect[1];
  }
  else {
    iVar8 = 1;
    iVar5 = iVar8;
  }
  iVar6 = ng_sol.vect[2];
  lVar9 = 0;
  lVar12 = 0;
  uVar13 = 0;
  nghost = 0;
  do {
    if ((long)this->namrlevs <= (long)uVar13) {
      pp_Var3 = this->linop->_vptr_MLLinOp;
      if (this->linop_prepared == false) {
        (*pp_Var3[0x1d])();
        this->linop_prepared = true;
      }
      else {
        iVar8 = (*pp_Var3[7])();
        if ((char)iVar8 != '\0') {
          (*this->linop->_vptr_MLLinOp[8])();
        }
      }
      lVar9 = 0;
      for (uVar13 = 0; (long)uVar13 < (long)this->namrlevs; uVar13 = uVar13 + 1) {
        MultiFab::MultiFab((MultiFab *)local_1b0,
                           (MultiFab *)
                           ((long)&((rh.
                                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                     .
                                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                   _vptr_FabArrayBase + lVar9),make_alias,0,
                           *(int *)((long)(&((rh.
                                              super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                              .
                                              super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                            n_grow + 1) + lVar9));
        Any::Any<amrex::MultiFab>((Any *)&ng,(MultiFab *)local_1b0);
        MultiFab::~MultiFab((MultiFab *)local_1b0);
        (*this->linop->_vptr_MLLinOp[0x18])(this->linop,uVar13 & 0xffffffff,&ng);
        if (ng.vect._0_8_ != 0) {
          (**(code **)(*(long *)ng.vect._0_8_ + 0x10))();
        }
        lVar9 = lVar9 + 0x180;
      }
      pMVar4 = this->linop;
      uVar13 = (ulong)(this->finest_amr_lev + 1);
      local_230 = uVar13 * 0x180;
      uVar14 = this->finest_amr_lev;
      while (-1 < (int)uVar14) {
        uVar10 = 0;
        pMVar11 = (MultiFab *)0x0;
        if (uVar14 != 0) {
          uVar10 = (ulong)uVar14;
          pMVar11 = in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10 - 1];
        }
        (*this->linop->_vptr_MLLinOp[0x10])
                  (this->linop,(ulong)uVar14,
                   (out->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar10],
                   in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar10],
                   rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10,pMVar11);
        if ((int)uVar14 < this->finest_amr_lev) {
          ppMVar1 = (out->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          (*this->linop->_vptr_MLLinOp[0x12])
                    (this->linop,(ulong)uVar14,ppMVar1[uVar10],
                     in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar10],
                     rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar10,ppMVar1[uVar13],
                     in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13],
                     (long)&((rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                              super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                              _M_impl.super__Vector_impl_data._M_start)->
                            super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase
                     + local_230);
          bVar7 = MLLinOp::isCellCentered(this->linop);
          if (bVar7) {
            ppMVar1 = (out->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar11 = ppMVar1[uVar10];
            EB_average_down(ppMVar1[uVar13],pMVar11,0,
                            (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
                            (pMVar4->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar10]);
          }
        }
        uVar13 = uVar13 - 1;
        local_230 = local_230 + -0x180;
        uVar14 = uVar14 - 1;
      }
      for (uVar13 = 0; (long)uVar13 <= (long)this->finest_amr_lev; uVar13 = uVar13 + 1) {
        if (this->cf_strategy == ghostnodes) {
          nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar13 & 0xffffffff,0);
        }
        MultiFab::negate((out->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar13],nghost);
      }
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector
                (&rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
      std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector
                (&in_raii.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&in);
      return;
    }
    if (this->cf_strategy == ghostnodes) {
      nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar13 & 0xffffffff,0);
      pMVar11 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13];
LAB_004e6384:
      in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = pMVar11;
    }
    else {
      ppMVar1 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar11 = ppMVar1[uVar13];
      uVar2 = *(undefined8 *)
               (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
      if (((iVar8 != (int)uVar2) || (iVar5 != (int)((ulong)uVar2 >> 0x20))) ||
         ((pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] != iVar6)) {
        ng.vect[2] = ng_sol.vect[2];
        ng.vect[0] = ng_sol.vect[0];
        ng.vect[1] = ng_sol.vect[1];
        pMVar11 = ppMVar1[uVar13];
        local_1b0._0_8_ = (_func_int **)0x1;
        local_1b0._24_8_ = 0;
        local_1b0._32_8_ = 0;
        local_1b0._8_8_ = 0;
        local_1b0._16_8_ = 0;
        (**(code **)(*(long *)((long)&((in_raii.
                                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                        .
                                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                      _vptr_FabArrayBase + lVar9) + 0x18))
                  ((long)&((in_raii.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            _M_impl.super__Vector_impl_data._M_start)->
                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                   lVar9,&(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                   &(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                   (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,&ng,
                   local_1b0,
                   **(undefined8 **)
                     ((long)&(((this->linop->m_factory).
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                             ).
                             super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar12));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + 0x10));
        pMVar11 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13];
        MultiFab::Copy((MultiFab *)
                       ((long)&((in_raii.
                                 super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               _vptr_FabArrayBase + lVar9),pMVar11,0,0,
                       (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost)
        ;
        pMVar11 = (MultiFab *)
                  ((long)&((in_raii.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            _M_impl.super__Vector_impl_data._M_start)->
                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                  lVar9);
        goto LAB_004e6384;
      }
      in.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = pMVar11;
    }
    pMVar11 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
    local_1b0._0_8_ = (_func_int **)0x1;
    local_1b0._24_8_ = 0;
    local_1b0._32_8_ = 0;
    local_1b0._8_8_ = 0;
    local_1b0._16_8_ = 0;
    (**(code **)(*(long *)((long)&((rh.
                                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                  _vptr_FabArrayBase + lVar9) + 0x10))
              ((long)&((rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>)
                      .super_FabArrayBase._vptr_FabArrayBase + lVar9,
               &(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
               &(pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
               (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost,
               local_1b0,
               **(undefined8 **)
                 ((long)&(((this->linop->m_factory).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + 0x10));
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               ((long)&((rh.super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>
                       ).super_FabArrayBase._vptr_FabArrayBase + lVar9),0.0);
    uVar13 = uVar13 + 1;
    lVar12 = lVar12 + 0x18;
    lVar9 = lVar9 + 0x180;
  } while( true );
}

Assistant:

void
MLMG::apply (const Vector<MultiFab*>& out, const Vector<MultiFab*>& a_in)
{
    BL_PROFILE("MLMG::apply()");

    Vector<MultiFab*> in(namrlevs);
    Vector<MultiFab> in_raii(namrlevs);
    Vector<MultiFab> rh(namrlevs);
    int nghost = 0;
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            nghost = linop.getNGrow(alev);
            in[alev] = a_in[alev];
        }
        else if (a_in[alev]->nGrowVect() == ng_sol)
        {
            in[alev] = a_in[alev];
        }
        else
        {
            IntVect ng = ng_sol;
            if (cf_strategy == CFStrategy::ghostnodes) ng = IntVect(nghost);
            in_raii[alev].define(a_in[alev]->boxArray(),
                                 a_in[alev]->DistributionMap(),
                                 a_in[alev]->nComp(), ng,
                                 MFInfo(), *linop.Factory(alev));
            MultiFab::Copy(in_raii[alev], *a_in[alev], 0, 0, a_in[alev]->nComp(), nghost);
            in[alev] = &(in_raii[alev]);
        }
        rh[alev].define(a_in[alev]->boxArray(),
                        a_in[alev]->DistributionMap(),
                        a_in[alev]->nComp(), nghost, MFInfo(),
                        *linop.Factory(alev));
        rh[alev].setVal(0.0);
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    for (int alev = 0; alev < namrlevs; ++alev) {
        Any a(MultiFab(rh[alev], amrex::make_alias, 0, rh[alev].nComp()));
        linop.applyInhomogNeumannTerm(alev, a);
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? in[alev-1] : nullptr;
        linop.solutionResidual(alev, *out[alev], *in[alev], rh[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *out[alev], *in[alev], rh[alev],
                         *out[alev+1], *in[alev+1], rh[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#else
                amrex::average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#endif
            }
        }
    }

#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *out[alev]);
    }
#endif

    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        if (cf_strategy == CFStrategy::ghostnodes)  nghost = linop.getNGrow(alev);
        out[alev]->negate(nghost);
    }
}